

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptrlist.c
# Opt level: O1

void * raviX_ptrlist_undo_last(PtrList **self)

{
  ushort uVar1;
  PtrList *pPVar2;
  void *pvVar3;
  char cVar4;
  PtrList *pPVar5;
  
  pPVar2 = *self;
  pPVar5 = pPVar2;
  if (pPVar2 != (PtrList *)0x0) {
    do {
      pPVar5 = pPVar5->prev_;
      uVar1 = *(ushort *)pPVar5;
      if ((char)uVar1 != '\0') {
        *(ushort *)pPVar5 = uVar1 & 0xff00 | uVar1 - 1 & 0xff;
        cVar4 = (char)(uVar1 - 1);
        pvVar3 = pPVar5->list_[cVar4];
        pPVar5->list_[cVar4] = (void *)0xf1f1f1f1;
        return pvVar3;
      }
    } while (pPVar5 != pPVar2);
  }
  return (void *)0x0;
}

Assistant:

void *raviX_ptrlist_undo_last(PtrList **self)
{
	PtrList *last, *first = *self;

	if (!first)
		return NULL;
	last = first;
	do {
		last = last->prev_;
		if (last->nr_) {
			void *ptr;
			int nr = --last->nr_;
			ptr = last->list_[nr];
			last->list_[nr] = (void *)((intptr_t)0xf1f1f1f1);
			return ptr;
		}
	} while (last != first);
	return NULL;
}